

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA2.c
# Opt level: O0

void Hacl_Hash_SHA2_sha224_init(uint32_t *hash)

{
  uint32_t x_7;
  uint32_t *os_7;
  uint32_t x_6;
  uint32_t *os_6;
  uint32_t x_5;
  uint32_t *os_5;
  uint32_t x_4;
  uint32_t *os_4;
  uint32_t x_3;
  uint32_t *os_3;
  uint32_t x_2;
  uint32_t *os_2;
  uint32_t x_1;
  uint32_t *os_1;
  uint32_t x;
  uint32_t *os;
  uint32_t i;
  uint32_t *hash_local;
  
  *hash = 0xc1059ed8;
  hash[1] = 0x367cd507;
  hash[2] = 0x3070dd17;
  hash[3] = 0xf70e5939;
  hash[4] = 0xffc00b31;
  hash[5] = 0x68581511;
  hash[6] = 0x64f98fa7;
  hash[7] = 0xbefa4fa4;
  return;
}

Assistant:

void Hacl_Hash_SHA2_sha224_init(uint32_t *hash)
{
  KRML_MAYBE_FOR8(i,
    0U,
    8U,
    1U,
    uint32_t *os = hash;
    uint32_t x = Hacl_Hash_SHA2_h224[i];
    os[i] = x;);
}